

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

bool isMacMechanism(CK_MECHANISM_PTR pMechanism)

{
  CK_MECHANISM_TYPE CVar1;
  
  if (pMechanism != (CK_MECHANISM_PTR)0x0) {
    CVar1 = pMechanism->mechanism;
    if ((long)CVar1 < 0x251) {
      if (CVar1 == 0x138) {
        return true;
      }
      if (CVar1 == 0x211) {
        return true;
      }
      if (CVar1 == 0x221) {
        return true;
      }
    }
    else if (((CVar1 - 0x251 < 0x21) && ((0x100010021U >> (CVar1 - 0x251 & 0x3f) & 1) != 0)) ||
            (CVar1 == 0x108a)) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool isMacMechanism(CK_MECHANISM_PTR pMechanism)
{
	if (pMechanism == NULL_PTR) return false;

	switch(pMechanism->mechanism) {
		case CKM_MD5_HMAC:
		case CKM_SHA_1_HMAC:
		case CKM_SHA224_HMAC:
		case CKM_SHA256_HMAC:
		case CKM_SHA384_HMAC:
		case CKM_SHA512_HMAC:
#ifdef WITH_GOST
		case CKM_GOSTR3411_HMAC:
#endif
		case CKM_DES3_CMAC:
		case CKM_AES_CMAC:
			return true;
		default:
			return false;
	}
}